

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture2DArray::Texture2DArray(Texture2DArray *this,Texture2DArray *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture2DArray *other_local;
  Texture2DArray *this_local;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  this->m_width = other->m_width;
  this->m_height = other->m_height;
  this->m_numLayers = other->m_numLayers;
  numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture2DArrayView::Texture2DArrayView(&this->m_view,numLevels,levels);
  return;
}

Assistant:

Texture2DArray::Texture2DArray (const Texture2DArray& other)
	: TextureLevelPyramid	(other)
	, m_width				(other.m_width)
	, m_height				(other.m_height)
	, m_numLayers			(other.m_numLayers)
	, m_view				(getNumLevels(), getLevels())
{
}